

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall ViewTest::elementAccessTest<false>(ViewTest *this)

{
  int *piVar1;
  ViewTest *pVVar2;
  bool bVar3;
  int iVar4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> it
  ;
  reference piVar6;
  size_t sVar7;
  undefined8 extraout_RAX;
  size_t sVar8;
  undefined8 uVar9;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  logic_error *plVar10;
  ulong uVar11;
  value_type *__val_1;
  code *pcVar12;
  bool bVar13;
  long lVar14;
  unsigned_long uVar15;
  undefined *puVar16;
  size_t sVar17;
  int iVar18;
  int iVar19;
  value_type *__val;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  int local_ac;
  int *local_a8;
  size_t local_a0;
  unsigned_long local_98;
  unsigned_long *local_90;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_88;
  undefined1 local_80 [16];
  size_t *local_70;
  size_t *local_68;
  size_t *local_60;
  size_t local_58;
  size_t local_50;
  CoordinateOrder local_48;
  bool local_44;
  unsigned_long *local_40;
  ViewTest *local_38;
  
  _Var5._M_current = (unsigned_long *)operator_new(0x10);
  *_Var5._M_current = 6;
  _Var5._M_current[1] = 4;
  local_a8 = this->data_;
  local_80._0_8_ = local_a8;
  local_38 = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_80 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_ac);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  it._M_current = (unsigned_long *)operator_new(0x10);
  *it._M_current = 0;
  it._M_current[1] = 0;
  sVar17 = 0;
  do {
    uVar15 = 0;
    do {
      *it._M_current = sVar17;
      it._M_current[1] = uVar15;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_80,sVar17,uVar15);
      iVar19 = *piVar6;
      piVar6 = andres::marray_detail::AccessOperatorHelper<false>::
               execute<int,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,false,std::allocator<unsigned_long>>
                         ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80,it);
      if (iVar19 != *piVar6) {
        plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar10,"test failed.");
        __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != 4);
    sVar17 = sVar17 + 1;
  } while (sVar17 != 6);
  operator_delete(it._M_current,0x10);
  operator_delete(local_70,local_58 * 0x18);
  operator_delete(_Var5._M_current,0x10);
  local_40 = (unsigned_long *)operator_new(0x18);
  *local_40 = 3;
  local_40[1] = 4;
  local_40[2] = 2;
  local_80._0_8_ = local_a8;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_80 + 8),
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_40,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(local_40 + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_ac);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  local_88._M_current = (unsigned_long *)operator_new(0x18);
  *local_88._M_current = 0;
  local_88._M_current[1] = 0;
  local_88._M_current[2] = 0;
  local_98 = 0;
  do {
    local_a0 = 0;
    do {
      uVar15 = 0;
      bVar3 = true;
      do {
        bVar13 = bVar3;
        *local_88._M_current = local_98;
        local_88._M_current[1] = local_a0;
        local_88._M_current[2] = uVar15;
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
        uVar9 = local_80._0_8_;
        if (((int *)local_80._0_8_ == (int *)0x0) || (local_58 != 3)) {
          plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar10,"Assertion failed.");
          pcVar12 = std::runtime_error::~runtime_error;
          puVar16 = &std::runtime_error::typeinfo;
LAB_0019d769:
          __cxa_throw(plVar10,puVar16,pcVar12);
        }
        sVar17 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80,3,local_a0,
                           uVar15);
        iVar19 = *(int *)(uVar9 + (sVar17 * local_98 + sVar7) * 4);
        piVar6 = andres::marray_detail::AccessOperatorHelper<false>::
                 execute<int,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,false,std::allocator<unsigned_long>>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80,local_88);
        if (iVar19 != *piVar6) {
          plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar10,"test failed.");
          pcVar12 = std::logic_error::~logic_error;
          puVar16 = &std::logic_error::typeinfo;
          goto LAB_0019d769;
        }
        uVar15 = 1;
        bVar3 = false;
      } while (bVar13);
      local_a0 = local_a0 + 1;
    } while (local_a0 != 4);
    local_98 = local_98 + 1;
  } while (local_98 != 3);
  operator_delete(local_88._M_current,0x18);
  operator_delete(local_70,local_58 * 0x18);
  operator_delete(local_40,0x18);
  local_80._0_8_ = local_38;
  local_70 = (size_t *)operator_new(0);
  local_58 = 0;
  local_50 = 1;
  local_48 = LastMajorOrder;
  local_44 = true;
  local_68 = local_70;
  local_60 = local_70;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  local_ac = 0;
  piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>
                     ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80,&local_ac);
  if (*piVar6 != 0x2a) {
    plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar10,"test failed.");
    __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  operator_delete(local_70,local_58 * 0x18);
  local_80._0_8_ = local_38;
  local_70 = (size_t *)operator_new(0);
  local_58 = 0;
  local_50 = 1;
  local_48 = LastMajorOrder;
  local_44 = true;
  local_68 = local_70;
  local_60 = local_70;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  local_ac = 0;
  piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>
                     ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80,&local_ac);
  if (*piVar6 != 0x2a) {
    plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar10,"test failed.");
    __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  operator_delete(local_70,local_58 * 0x18);
  _Var5._M_current = (unsigned_long *)operator_new(8);
  *_Var5._M_current = 0x18;
  local_80._0_8_ = local_a8;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_80 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_ac);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  sVar17 = 0;
  do {
    piVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80,sVar17);
    if (*piVar6 != local_a8[sVar17]) {
      plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar10,"test failed.");
      __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    sVar17 = sVar17 + 1;
  } while (sVar17 != 0x18);
  operator_delete(local_70,local_58 * 0x18);
  operator_delete(_Var5._M_current,8);
  _Var5._M_current = (unsigned_long *)operator_new(8);
  *_Var5._M_current = 0x18;
  local_80._0_8_ = local_a8;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_80 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_ac);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  sVar17 = 0;
  do {
    piVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80,sVar17);
    if (*piVar6 != local_a8[sVar17]) {
      plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar10,"test failed.");
      __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    sVar17 = sVar17 + 1;
  } while (sVar17 != 0x18);
  operator_delete(local_70,local_58 * 0x18);
  operator_delete(_Var5._M_current,8);
  _Var5._M_current = (unsigned_long *)operator_new(0x10);
  *_Var5._M_current = 4;
  _Var5._M_current[1] = 6;
  local_80._0_8_ = local_a8;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_80 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_ac);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  iVar19 = 0;
  lVar14 = 0;
  do {
    piVar1 = local_a8;
    iVar4 = (int)lVar14;
    lVar14 = (long)iVar4 + 4;
    sVar17 = 0;
    do {
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_80,sVar17,iVar19);
      if (*piVar6 != piVar1[(long)iVar4 + sVar17]) {
        plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar10,"test failed.");
        __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar17 = sVar17 + 1;
    } while (sVar17 != 4);
    iVar19 = iVar19 + 1;
  } while (iVar19 != 6);
  operator_delete(local_70,local_58 * 0x18);
  operator_delete(_Var5._M_current,0x10);
  _Var5._M_current = (unsigned_long *)operator_new(0x10);
  *_Var5._M_current = 4;
  _Var5._M_current[1] = 6;
  local_80._0_8_ = local_a8;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_80 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_ac);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  iVar19 = 0;
  lVar14 = 0;
  do {
    piVar1 = local_a8;
    iVar4 = (int)lVar14;
    lVar14 = (long)iVar4 + 4;
    sVar17 = 0;
    do {
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_80,sVar17,iVar19);
      if (*piVar6 != piVar1[(long)iVar4 + sVar17]) {
        plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar10,"test failed.");
        __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar17 = sVar17 + 1;
    } while (sVar17 != 4);
    iVar19 = iVar19 + 1;
  } while (iVar19 != 6);
  operator_delete(local_70,local_58 * 0x18);
  operator_delete(_Var5._M_current,0x10);
  local_90 = (unsigned_long *)operator_new(0x18);
  *local_90 = 3;
  local_90[1] = 4;
  local_90[2] = 2;
  local_80._0_8_ = local_a8;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_80 + 8),
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_90,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(local_90 + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_ac);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  local_a0 = 0;
  uVar9 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  uVar11 = 0;
  do {
    local_88._M_current._0_4_ = (int)uVar9;
    local_40 = (unsigned_long *)CONCAT44(local_40._4_4_,(int)uVar11 + 0xc);
    sVar17 = 0;
    local_98 = uVar11;
    do {
      piVar1 = local_a8;
      iVar19 = (int)local_98;
      local_98 = (unsigned_long)(iVar19 + 3);
      lVar14 = 0;
      do {
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
        uVar9 = local_80._0_8_;
        if (((int *)local_80._0_8_ == (int *)0x0) || (local_58 != 3)) {
          plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar10,"Assertion failed.");
          pcVar12 = std::runtime_error::~runtime_error;
          puVar16 = &std::runtime_error::typeinfo;
LAB_0019d7c7:
          __cxa_throw(plVar10,puVar16,pcVar12);
        }
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80,0);
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::elementAccessHelper<int>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80,3,sVar17,
                           (int)local_a0);
        if (*(int *)(uVar9 + (sVar7 * lVar14 + sVar8) * 4) != piVar1[iVar19 + lVar14]) {
          plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar10,"test failed.");
          pcVar12 = std::logic_error::~logic_error;
          puVar16 = &std::logic_error::typeinfo;
          goto LAB_0019d7c7;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      sVar17 = sVar17 + 1;
    } while (sVar17 != 4);
    local_a0 = 1;
    uVar9 = 0;
    uVar11 = (ulong)local_40 & 0xffffffff;
  } while (((ulong)local_88._M_current & 1) != 0);
  operator_delete(local_70,local_58 * 0x18);
  operator_delete(local_90,0x18);
  local_90 = (unsigned_long *)operator_new(0x18);
  *local_90 = 3;
  local_90[1] = 4;
  local_90[2] = 2;
  local_80._0_8_ = local_a8;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_80 + 8),
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_90,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(local_90 + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_ac);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  local_a0 = 0;
  uVar9 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
  uVar11 = 0;
  do {
    local_88._M_current._0_4_ = (int)uVar9;
    local_40 = (unsigned_long *)CONCAT44(local_40._4_4_,(int)uVar11 + 0xc);
    sVar17 = 0;
    local_98 = uVar11;
    do {
      piVar1 = local_a8;
      iVar19 = (int)local_98;
      local_98 = (unsigned_long)(iVar19 + 3);
      lVar14 = 0;
      do {
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
        uVar9 = local_80._0_8_;
        if (((int *)local_80._0_8_ == (int *)0x0) || (local_58 != 3)) {
          plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar10,"Assertion failed.");
          pcVar12 = std::runtime_error::~runtime_error;
          puVar16 = &std::runtime_error::typeinfo;
LAB_0019d825:
          __cxa_throw(plVar10,puVar16,pcVar12);
        }
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80,0);
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::elementAccessHelper<int>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80,3,sVar17,
                           (int)local_a0);
        if (*(int *)(uVar9 + (sVar7 * lVar14 + sVar8) * 4) != piVar1[iVar19 + lVar14]) {
          plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar10,"test failed.");
          pcVar12 = std::logic_error::~logic_error;
          puVar16 = &std::logic_error::typeinfo;
          goto LAB_0019d825;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      sVar17 = sVar17 + 1;
    } while (sVar17 != 4);
    local_a0 = 1;
    uVar9 = 0;
    uVar11 = (ulong)local_40 & 0xffffffff;
    if (((ulong)local_88._M_current & 1) == 0) {
      operator_delete(local_70,local_58 * 0x18);
      operator_delete(local_90,0x18);
      local_90 = (unsigned_long *)operator_new(0x20);
      *local_90 = 3;
      local_90[1] = 4;
      local_90[2] = 2;
      local_90[3] = 2;
      local_80._0_8_ = local_38->data100_;
      local_38 = (ViewTest *)local_80._0_8_;
      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Geometry<std::allocator<unsigned_long>> *)(local_80 + 8),
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_90,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(local_90 + 4),&andres::defaultOrder,&andres::defaultOrder,
                 (allocator_type *)&local_ac);
      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
      iVar19 = 0;
      uVar9 = CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
      uVar11 = 0;
      do {
        local_a8 = (int *)CONCAT44(local_a8._4_4_,(int)uVar9);
        iVar4 = (int)uVar11 + 0x18;
        local_40 = (unsigned_long *)CONCAT44(local_40._4_4_,iVar4);
        uVar9 = CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
        iVar4 = 0;
        local_98 = uVar11;
        do {
          local_88._M_current._0_4_ = (int)uVar9;
          iVar18 = 0;
          sVar17 = local_98;
          local_98 = (ulong)((int)local_98 + 0xc);
          do {
            pVVar2 = local_38;
            local_a0 = (size_t)((int)sVar17 + 3);
            sVar7 = 0;
            do {
              piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                 ((View<int,false,std::allocator<unsigned_long>> *)local_80,sVar7,
                                  iVar18,iVar4,iVar19);
              if (*piVar6 != *(int *)((long)pVVar2 + ((long)(int)sVar17 + sVar7) * 4)) {
                plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar10,"test failed.");
                __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              sVar7 = sVar7 + 1;
            } while (sVar7 != 3);
            iVar18 = iVar18 + 1;
            sVar17 = local_a0;
          } while (iVar18 != 4);
          iVar4 = 1;
          uVar9 = 0;
        } while (((ulong)local_88._M_current & 1) != 0);
        iVar19 = 1;
        uVar11 = (ulong)local_40 & 0xffffffff;
      } while (((ulong)local_a8 & 1) != 0);
      operator_delete(local_70,local_58 * 0x18);
      operator_delete(local_90,0x20);
      local_90 = (unsigned_long *)operator_new(0x20);
      *local_90 = 3;
      local_90[1] = 4;
      local_90[2] = 2;
      local_90[3] = 2;
      local_80._0_8_ = local_38;
      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Geometry<std::allocator<unsigned_long>> *)(local_80 + 8),
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_90,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(local_90 + 4),&andres::defaultOrder,&andres::defaultOrder,
                 (allocator_type *)&local_ac);
      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
      iVar19 = 0;
      uVar9 = CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),1);
      uVar11 = 0;
      do {
        local_a8 = (int *)CONCAT44(local_a8._4_4_,(int)uVar9);
        iVar4 = (int)uVar11 + 0x18;
        local_40 = (unsigned_long *)CONCAT44(local_40._4_4_,iVar4);
        uVar9 = CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
        iVar4 = 0;
        local_98 = uVar11;
        do {
          local_88._M_current._0_4_ = (int)uVar9;
          iVar18 = 0;
          sVar17 = local_98;
          local_98 = (ulong)((int)local_98 + 0xc);
          do {
            pVVar2 = local_38;
            local_a0 = (size_t)((int)sVar17 + 3);
            sVar7 = 0;
            do {
              piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                 ((View<int,false,std::allocator<unsigned_long>> *)local_80,sVar7,
                                  iVar18,iVar4,iVar19);
              if (*piVar6 != *(int *)((long)pVVar2 + ((long)(int)sVar17 + sVar7) * 4)) {
                plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar10,"test failed.");
                __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              sVar7 = sVar7 + 1;
            } while (sVar7 != 3);
            iVar18 = iVar18 + 1;
            sVar17 = local_a0;
          } while (iVar18 != 4);
          iVar4 = 1;
          uVar9 = 0;
        } while (((ulong)local_88._M_current & 1) != 0);
        iVar19 = 1;
        uVar11 = (ulong)local_40 & 0xffffffff;
      } while (((ulong)local_a8 & 1) != 0);
      operator_delete(local_70,local_58 * 0x18);
      operator_delete(local_90,0x20);
      return;
    }
  } while( true );
}

Assistant:

void ViewTest::elementAccessTest(){
    // element access by coordinate
    {
        // 2D
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> w(2);
        
            for(std::size_t x=0; x<6; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    w[0] = x;
                    w[1] = y;
                    test(v(x, y) == v(w.begin()));
                }
            }
        }
        // 3D 
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> w(3);
        
            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        w[0] = x;
                        w[1] = y;
                        w[2] = z; 
                        test(v(x, y, z) == v(w.begin()));
                    }
                }
            }
        }
    }
    // scalar
    {
        {
            andres::View<int, constTarget> v(&scalar_);
            
            test(v(0) == 42);
        }
        // const
        {
            andres::View<int, constTarget> const v(&scalar_);
            
            test(v(0) == 42);
        }
    }
    // 1D 
    {
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

            for(std::size_t j=0; j<24; ++j) {
                test(v(j) == data_[j]); 
            }
        }
        // const 
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> const v(shape.begin(), shape.end(), data_);

            for(std::size_t j=0; j<24; ++j) {
                test(v(j) == data_[j]); 
            }
        }
    }
    // 2D
    {
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 4;
            shape[1] = 6;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

            int i = 0;
            for(int y = 0; y < 6; ++y){
                for(int x = 0; x < 4; ++x){
                    test(v(x, y) == data_[i]);
                    ++i;
                }
            }
        }
        // const 
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 4;
            shape[1] = 6;
            andres::View<int, constTarget> const v(shape.begin(), shape.end(), data_);

            int i = 0;
            for(int y = 0; y < 6; ++y){
                for(int x = 0; x < 4; ++x){
                    test(v(x, y) == data_[i]);
                    ++i;
                }
            }
        }
    }
    // 3D 
    {
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

            int i = 0;
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 4; ++y){
                    for(int x = 0; x < 3; ++x){
                        test(v(x, y, z) == data_[i]);
                        ++i;
                    }
                }
            }
        }
        // const
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> const v(shape.begin(), shape.end(), data_);

            int i = 0;
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 4; ++y){
                    for(int x = 0; x < 3; ++x){
                        test(v(x, y, z) == data_[i]);
                        ++i;
                    }
                }
            }
        }
    }
    // 4D 
    {
        {
            std::vector<std::size_t> shape(4);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            shape[3] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data100_);

            int i = 0;
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 2; ++y){
                    for(int x = 0; x < 4; ++x){
                        for(int w = 0; w < 3; ++w){
                            test(v(w, x, y, z) == data100_[i]);
                            ++i;
                        }
                    }
                }
            }
        }
        // const 
        {
            std::vector<std::size_t> shape(4);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            shape[3] = 2;
            andres::View<int, constTarget> const v(shape.begin(), shape.end(), data100_);

            int i = 0;
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 2; ++y){
                    for(int x = 0; x < 4; ++x){
                        for(int w = 0; w < 3; ++w){
                            test(v(w, x, y, z) == data100_[i]);
                            ++i;
                        }
                    }
                }
            }
        }
    }
}